

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O2

bool __thiscall
ON_SubD::SetFragmentColorsFromCallback
          (ON_SubD *this,bool bLazySet,ON_SHA1_Hash fragment_colors_settings_hash,
          ON_MappingTag fragment_colors_mapping_tag,ON__UINT_PTR callback_context,
          _func_ON_Color_ON__UINT_PTR_ON_MappingTag_ptr_ON_SubD_ptr_ON_SubDComponentPtr_ON_3dPoint_ptr_ON_3dVector_ptr_ON_3dPoint_ptr_ON_SurfaceCurvature_ptr
          *color_callback)

{
  byte *pbVar1;
  undefined8 uVar2;
  bool bVar3;
  bool bVar4;
  ON_SubDimple *pOVar5;
  ON_SubDMeshFragment *this_00;
  undefined7 in_register_00000031;
  ON_SHA1_Hash local_dc;
  ON_MappingTag local_c8;
  
  if ((int)CONCAT71(in_register_00000031,bLazySet) != 0) {
    FragmentColorsSettingsHash(&local_dc,this);
    bVar3 = ::operator==(&fragment_colors_settings_hash,&local_dc);
    if (bVar3) {
      ColorsMappingTag(&local_c8,this);
      bVar3 = ::operator==(&fragment_colors_mapping_tag,&local_c8);
      if ((bVar3) && (bVar3 = HasFragmentColors(this), bVar3)) {
        return true;
      }
    }
  }
  pOVar5 = SubDimple(this);
  if (pOVar5 == (ON_SubDimple *)0x0) {
    bVar3 = false;
  }
  else {
    ON_SubDMeshFragmentIterator::ON_SubDMeshFragmentIterator
              ((ON_SubDMeshFragmentIterator *)&local_c8,this);
    this_00 = ON_SubDMeshFragmentIterator::FirstFragment((ON_SubDMeshFragmentIterator *)&local_c8);
    bVar3 = false;
    while (this_00 != (ON_SubDMeshFragment *)0x0) {
      bVar4 = ON_SubDMeshFragment::SetColorsFromCallback
                        (this_00,&fragment_colors_mapping_tag,this,callback_context,color_callback);
      if (bVar4) {
        pbVar1 = (byte *)((long)&this_00->m_vertex_capacity_etc + 1);
        *pbVar1 = *pbVar1 | 0x20;
        bVar3 = true;
      }
      else {
        ON_SubDMeshFragment::ClearColors(this_00);
      }
      this_00 = ON_SubDMeshFragmentIterator::NextFragment((ON_SubDMeshFragmentIterator *)&local_c8);
    }
    if (bVar3) {
      *(undefined4 *)((pOVar5->m_fragment_colors_settings_hash).m_digest + 0x10) =
           fragment_colors_settings_hash.m_digest._16_4_;
      *(undefined8 *)(pOVar5->m_fragment_colors_settings_hash).m_digest =
           fragment_colors_settings_hash.m_digest._0_8_;
      *(undefined8 *)((pOVar5->m_fragment_colors_settings_hash).m_digest + 8) =
           fragment_colors_settings_hash.m_digest._8_8_;
      SetColorsMappingTag(this,&fragment_colors_mapping_tag);
      ChangeRenderContentSerialNumber(this);
    }
    else {
      *(undefined4 *)((pOVar5->m_fragment_colors_settings_hash).m_digest + 0x10) =
           ON_SHA1_Hash::EmptyContentHash.m_digest._16_4_;
      uVar2 = ON_SHA1_Hash::EmptyContentHash.m_digest._8_8_;
      *(undefined8 *)(pOVar5->m_fragment_colors_settings_hash).m_digest =
           ON_SHA1_Hash::EmptyContentHash.m_digest._0_8_;
      *(undefined8 *)((pOVar5->m_fragment_colors_settings_hash).m_digest + 8) = uVar2;
      SetColorsMappingTag(this,&ON_MappingTag::Unset);
    }
    ON_SubDMeshFragmentIterator::~ON_SubDMeshFragmentIterator
              ((ON_SubDMeshFragmentIterator *)&local_c8);
  }
  return bVar3;
}

Assistant:

bool ON_SubD::SetFragmentColorsFromCallback(
  bool bLazySet,
  ON_SHA1_Hash fragment_colors_settings_hash,
  ON_MappingTag fragment_colors_mapping_tag,
  ON__UINT_PTR callback_context,
  const ON_Color(*color_callback)(
    ON__UINT_PTR callback_context,
    const ON_MappingTag& mapping_tag,
    const ON_SubD& subd,
    ON_SubDComponentPtr cptr, 
    const ON_3dPoint& P, 
    const ON_3dVector& N, 
    const ON_3dPoint& T, 
    const ON_SurfaceCurvature& K)
) const
{
  if (bLazySet
    && fragment_colors_settings_hash == FragmentColorsSettingsHash()
    && fragment_colors_mapping_tag == ColorsMappingTag()
    && this->HasFragmentColors()
    )
  {
    // This subd has fragments with per vertex colors.
    // The settings used to create those colors exactly
    // match the settings that color_callback() will use
    // to assign colors. The caller said to be lazy, so
    // assume the existing colors are correct and return.
    return true;
  }

  bool bFragmentVetexColorsSet = false;
  const ON_SubDimple* subdimple = this->SubDimple();
  if (nullptr != subdimple)
  {
    ON_SubDMeshFragmentIterator fragit(*this);
    for (const ON_SubDMeshFragment* frag = fragit.FirstFragment(); nullptr != frag; frag = fragit.NextFragment())
    {
      const bool b = frag->SetColorsFromCallback(
        fragment_colors_mapping_tag,
        *this,
        callback_context,
        color_callback
      );
      if (b)
      {
        bFragmentVetexColorsSet = true;
        frag->SetColorsExistForExperts(true);
      }
      else
        frag->SetColorsExistForExperts(false);
    }
    if (bFragmentVetexColorsSet)
    {
      subdimple->Internal_SetFragmentColorsSettingsHash(fragment_colors_settings_hash);
      SetColorsMappingTag(fragment_colors_mapping_tag);
      ChangeRenderContentSerialNumber();
    }
    else
    {
      subdimple->Internal_SetFragmentColorsSettingsHash(ON_SHA1_Hash::EmptyContentHash);
      this->SetColorsMappingTag(ON_MappingTag::Unset);
    }
  }

  return bFragmentVetexColorsSet;
}